

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_15::BinaryReaderObjdump::OnComdatEntry
          (BinaryReaderObjdump *this,ComdatType kind,Index index)

{
  ObjdumpNames *this_00;
  string_view sVar1;
  
  if (kind == Function) {
    PrintDetails(this,"    - func[%u]",(ulong)index);
    this_00 = &((this->super_BinaryReaderObjdumpBase).objdump_state_)->function_names;
  }
  else {
    if (kind != Data) goto LAB_001164d4;
    PrintDetails(this,"    - segment[%u]",(ulong)index);
    this_00 = &((this->super_BinaryReaderObjdumpBase).objdump_state_)->segment_names;
  }
  sVar1 = ObjdumpNames::Get(this_00,index);
  if (sVar1._M_len != 0) {
    PrintDetails(this," <%.*s>",(ulong)(uint)sVar1._M_len,sVar1._M_str);
  }
LAB_001164d4:
  PrintDetails(this,"\n");
  return (Result)Ok;
}

Assistant:

Result BinaryReaderObjdump::OnComdatEntry(ComdatType kind, Index index) {
  switch (kind) {
    case ComdatType::Data: {
      PrintDetails("    - segment[%" PRIindex "]", index);
      auto name = GetSegmentName(index);
      if (!name.empty()) {
        PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
      }
      break;
    }
    case ComdatType::Function: {
      PrintDetails("    - func[%" PRIindex "]", index);
      auto name = GetFunctionName(index);
      if (!name.empty()) {
        PrintDetails(" <" PRIstringview ">", WABT_PRINTF_STRING_VIEW_ARG(name));
      }
      break;
    }
  }
  PrintDetails("\n");
  return Result::Ok;
}